

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O0

double RDL_countPaths(uint a,uint b,uint V,RDL_sPathInfo *spi)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  void *__ptr;
  uint *indegree_00;
  uint *__ptr_00;
  double result;
  double *nof_paths;
  uint *empty_set;
  uint *indegree;
  uint empty_end;
  uint vertex;
  uint curr;
  uint i;
  RDL_sPathInfo *spi_local;
  uint V_local;
  uint b_local;
  uint a_local;
  
  indegree._0_4_ = 0;
  __ptr = malloc((ulong)V << 3);
  indegree_00 = (uint *)malloc((ulong)V << 2);
  __ptr_00 = (uint *)malloc((ulong)V << 2);
  for (vertex = 0; vertex < V; vertex = vertex + 1) {
    *(undefined8 *)((long)__ptr + (ulong)vertex * 8) = 0;
    indegree_00[vertex] = 0xffffffff;
  }
  RDL_findIndegree(a,b,indegree_00,spi);
  for (vertex = 0; vertex < V; vertex = vertex + 1) {
    if (indegree_00[vertex] == 0) {
      __ptr_00[(uint)indegree] = vertex;
      indegree._0_4_ = (uint)indegree + 1;
      *(undefined8 *)((long)__ptr + (ulong)vertex * 8) = 0x3ff0000000000000;
    }
  }
  if (((uint)indegree == 1) && (*__ptr_00 == b)) {
    while ((uint)indegree != 0) {
      uVar2 = __ptr_00[(uint)indegree - 1];
      indegree._0_4_ = (uint)indegree - 1;
      for (vertex = 0; vertex < spi->dPaths[a]->degree[uVar2]; vertex = vertex + 1) {
        uVar3 = spi->dPaths[a]->adjList[uVar2][vertex][0];
        indegree_00[uVar3] = indegree_00[uVar3] - 1;
        *(double *)((long)__ptr + (ulong)uVar3 * 8) =
             *(double *)((long)__ptr + (ulong)uVar2 * 8) +
             *(double *)((long)__ptr + (ulong)uVar3 * 8);
        if (indegree_00[uVar3] == 0) {
          __ptr_00[(uint)indegree] = uVar3;
          indegree._0_4_ = (uint)indegree + 1;
        }
      }
    }
    dVar1 = *(double *)((long)__ptr + (ulong)a * 8);
    free(__ptr);
    free(indegree_00);
    free(__ptr_00);
    return dVar1;
  }
  (*RDL_outputFunc)(RDL_ERROR,"invalid topological sort!");
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLhandler.c"
                ,0x5c,
                "double RDL_countPaths(unsigned int, unsigned int, unsigned int, const RDL_sPathInfo *)"
               );
}

Assistant:

double RDL_countPaths(unsigned a, unsigned b,
    unsigned V, const RDL_sPathInfo *spi)
{
  unsigned i, curr, vertex, empty_end=0;
  unsigned *indegree, *empty_set;
  double *nof_paths, result;

  nof_paths = malloc(V * sizeof(*nof_paths));
  indegree = malloc(V * sizeof(*indegree));
  empty_set = malloc(V * sizeof(*empty_set));
  for (i = 0; i < V; ++i) {
    nof_paths[i] = 0.0;
    indegree[i] = UINT_MAX;
  }

  RDL_findIndegree(a, b, indegree, spi);

  for (i = 0; i < V; ++i) {
    if (indegree[i] == 0) {
      empty_set[empty_end] = i;
      ++empty_end;
      nof_paths[i] = 1.0;
    }
  }

  if (empty_end != 1 || empty_set[0] != b) {
    RDL_outputFunc(RDL_ERROR, "invalid topological sort!");
    /* should never happen */
    assert(0);
    free(nof_paths);
    free(indegree);
    free(empty_set);
    return DBL_MAX;
  }

  /* look at the nodes in an topological sort */
  while (empty_end) {
    curr = empty_set[empty_end-1];
    --empty_end;
    for(i=0; i<spi->dPaths[a]->degree[curr]; ++i) {
      vertex = spi->dPaths[a]->adjList[curr][i][0];
      --indegree[vertex];
      nof_paths[vertex] += nof_paths[curr];
      if (!indegree[vertex]) {
        empty_set[empty_end] = vertex;
        ++empty_end;
      }
    }
  }

  result = nof_paths[a];

  free(nof_paths);
  free(indegree);
  free(empty_set);

  return result;
}